

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ZSTD_longLengthType_e ZVar4;
  seqDef *psVar5;
  seqDef *psVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint *puVar19;
  repcodes_t updatedRepcodes;
  undefined8 local_60;
  uint local_58;
  long local_50;
  ZSTD_Sequence *local_48;
  ulong local_40;
  size_t local_38;
  
  local_38 = (zc->seqCollector).seqIndex;
  uVar10 = (zc->seqCollector).maxSequences;
  if (uVar10 <= local_38 + 1) {
    __assert_fail("zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xcf8,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  psVar5 = (zc->seqStore).sequencesStart;
  psVar6 = (zc->seqStore).sequences;
  lVar16 = (long)psVar6 - (long)psVar5 >> 3;
  local_40 = lVar16 + 1;
  if (uVar10 < local_40) {
    __assert_fail("zc->seqCollector.maxSequences >= seqStoreSeqSize + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xcfa,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  uVar10 = (long)(zc->seqStore).lit - (long)(zc->seqStore).litStart;
  local_48 = (zc->seqCollector).seqStart;
  pZVar7 = (zc->blockState).prevCBlock;
  uVar13 = pZVar7->rep[2];
  local_58 = uVar13;
  local_60 = *(undefined8 *)pZVar7->rep;
  uVar8 = local_60;
  local_50 = local_38 * 0x10;
  if (psVar6 == psVar5) {
    uVar11 = 0;
    uVar17 = 0;
  }
  else {
    local_60._4_4_ = (uint)((ulong)local_60 >> 0x20);
    uVar3 = (zc->seqStore).longLengthPos;
    puVar19 = &local_48[local_38].rep;
    uVar17 = 0;
    uVar11 = 0;
    uVar18 = (uint)local_60;
    uVar12 = local_60._4_4_;
    local_60 = uVar8;
    do {
      uVar9 = psVar5[uVar17].offBase;
      uVar1 = psVar5[uVar17].litLength;
      puVar19[-2] = (uint)uVar1;
      uVar2 = psVar5[uVar17].mlBase;
      puVar19[-1] = uVar2 + 3;
      *puVar19 = 0;
      if (uVar3 == uVar17) {
        ZVar4 = (zc->seqStore).longLengthType;
        if (ZVar4 == ZSTD_llt_matchLength) {
          puVar19[-1] = uVar2 + 0x10003;
        }
        else if (ZVar4 == ZSTD_llt_literalLength) {
          puVar19[-2] = uVar1 + 0x10000;
        }
      }
      uVar15 = uVar9 - 3;
      uVar14 = uVar15;
      if (uVar9 < 4) {
        *puVar19 = uVar9;
        if (puVar19[-2] == 0) {
          if (uVar9 == 3) {
            uVar14 = uVar18 - 1;
          }
          else {
            uVar14 = *(uint *)((long)&local_60 + (ulong)uVar9 * 4);
          }
        }
        else {
          uVar14 = *(uint *)((long)&local_60 + (ulong)(uVar9 - 1) * 4);
        }
      }
      ((ZSTD_Sequence *)(puVar19 + -3))->offset = uVar14;
      if (uVar9 < 4) {
        if (uVar9 == 0) {
          __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
        }
        uVar9 = (uVar9 + (uVar1 == 0)) - 1;
        uVar15 = uVar18;
        if (uVar9 != 0) {
          if (uVar9 == 3) {
            uVar15 = uVar18 - 1;
          }
          else {
            uVar15 = *(uint *)((long)&local_60 + (ulong)uVar9 * 4);
          }
          if (uVar9 == 1) {
            uVar12 = uVar13;
          }
          goto LAB_007f48c4;
        }
      }
      else {
LAB_007f48c4:
        local_58 = uVar12;
        local_60 = CONCAT44(uVar18,uVar15);
        uVar13 = uVar12;
        uVar12 = uVar18;
      }
      uVar18 = uVar15;
      uVar11 = uVar11 + puVar19[-2];
      uVar17 = uVar17 + 1;
      puVar19 = puVar19 + 4;
    } while (lVar16 + (ulong)(lVar16 == 0) != uVar17);
  }
  if (uVar10 < uVar11) {
    __assert_fail("seqStoreLiteralsSize >= literalsRead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xd23,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  local_48[local_38 + uVar17].litLength = (int)uVar10 - (int)uVar11;
  local_48[local_38 + uVar17].offset = 0;
  local_48[local_38 + uVar17].matchLength = 0;
  local_48[local_38 + uVar17].rep = 0;
  (zc->seqCollector).seqIndex = local_38 + local_40;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offBase - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offBase <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offBase;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        ZSTD_updateRep(updatedRepcodes.rep,
                       seqStoreSeqs[i].offBase,
                       seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}